

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relaxng.c
# Opt level: O1

xmlRelaxNGDefinePtr_conflict
xmlRelaxNGTryUnlink(xmlRelaxNGParserCtxtPtr ctxt,xmlRelaxNGDefinePtr_conflict cur,
                   xmlRelaxNGDefinePtr_conflict parent,xmlRelaxNGDefinePtr_conflict prev)

{
  if (parent != (xmlRelaxNGDefinePtr_conflict)0x0) {
    parent->next = *(xmlRelaxNGDefinePtr *)&ctxt->flags;
    return parent;
  }
  if (cur != (xmlRelaxNGDefinePtr_conflict)0x0) {
    if ((xmlRelaxNGParserCtxtPtr)cur->content == ctxt) {
      cur->content = *(xmlRelaxNGDefinePtr *)&ctxt->flags;
    }
    else if ((xmlRelaxNGParserCtxtPtr)cur->attrs == ctxt) {
      cur->attrs = *(xmlRelaxNGDefinePtr *)&ctxt->flags;
    }
    else if ((xmlRelaxNGParserCtxtPtr)cur->nameClass == ctxt) {
      cur->nameClass = *(xmlRelaxNGDefinePtr *)&ctxt->flags;
    }
    return (xmlRelaxNGDefinePtr_conflict)0x0;
  }
  *(undefined4 *)&ctxt->userData = 0xffffffff;
  return (xmlRelaxNGDefinePtr_conflict)ctxt;
}

Assistant:

static xmlRelaxNGDefinePtr
xmlRelaxNGTryUnlink(xmlRelaxNGParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                    xmlRelaxNGDefinePtr cur,
                    xmlRelaxNGDefinePtr parent, xmlRelaxNGDefinePtr prev)
{
    if (prev != NULL) {
        prev->next = cur->next;
    } else {
        if (parent != NULL) {
            if (parent->content == cur)
                parent->content = cur->next;
            else if (parent->attrs == cur)
                parent->attrs = cur->next;
            else if (parent->nameClass == cur)
                parent->nameClass = cur->next;
        } else {
            cur->type = XML_RELAXNG_NOOP;
            prev = cur;
        }
    }
    return (prev);
}